

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_reference_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::PositionalReferenceExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PositionalReferenceExpression *this)

{
  string local_30;
  
  ::std::__cxx11::to_string(&local_30,this->index);
  ::std::operator+(__return_storage_ptr__,"#",&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string PositionalReferenceExpression::ToString() const {
	return "#" + to_string(index);
}